

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O0

void __thiscall
SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::~ServerBase
          (ServerBase<asio::basic_stream_socket<asio::ip::tcp>_> *this)

{
  element_type *this_00;
  ServerBase<asio::basic_stream_socket<asio::ip::tcp>_> *this_local;
  
  this->_vptr_ServerBase = (_func_int **)&PTR__ServerBase_0029f398;
  this_00 = std::
            __shared_ptr_access<SimpleWeb::ScopeRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<SimpleWeb::ScopeRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->handler_runner);
  ScopeRunner::stop(this_00);
  stop(this);
  std::shared_ptr<SimpleWeb::ScopeRunner>::~shared_ptr(&this->handler_runner);
  std::shared_ptr<std::mutex>::~shared_ptr(&this->connections_mutex);
  std::
  shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Connection_*,_std::hash<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Connection_*>,_std::equal_to<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Connection_*>,_std::allocator<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Connection_*>_>_>
  ::~shared_ptr(&this->connections);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads);
  std::
  unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  ::~unique_ptr(&this->acceptor);
  std::shared_ptr<asio::io_context>::~shared_ptr(&this->io_service);
  std::
  function<void_(std::unique_ptr<asio::basic_stream_socket<asio::ip::tcp>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp>_>_>_&,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>
  ::~function(&this->on_upgrade);
  std::
  function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>,_const_std::error_code_&)>
  ::~function(&this->on_error);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>_>_>_>
  ::~map(&this->default_resource);
  std::
  map<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::regex_orderable,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>_>_>_>,_std::less<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::regex_orderable>,_std::allocator<std::pair<const_SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::regex_orderable,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>_>_>_>_>_>_>
  ::~map(&this->resource);
  Config::~Config(&this->config);
  return;
}

Assistant:

virtual ~ServerBase() noexcept {
      handler_runner->stop();
      stop();
    }